

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  bool bVar1;
  string *input;
  undefined1 local_40 [8];
  string name;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  name.field_2._8_8_ = descriptor;
  input = Descriptor::name_abi_cxx11_(descriptor);
  ToCamelCase((string *)local_40,input,true);
  bVar1 = IsForbiddenKotlin((string *)local_40);
  if (bVar1) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"_"
                  );
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinFactoryName(
    const Descriptor* descriptor) {
  std::string name = ToCamelCase(descriptor->name(), /* lower_first = */ true);
  return IsForbiddenKotlin(name) ? name + "_" : name;
}